

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::Matchers::Impl::StdString::Equals::match(Equals *this,string *expr)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  string local_38;
  
  CasedString::adjustString(&local_38,&this->m_data,expr);
  __n = (this->m_data).m_str._M_string_length;
  if (__n == local_38._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->m_data).m_str._M_dataplus._M_p,local_38._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

virtual bool match(std::string const& expr) const {
						return m_data.m_str == m_data.adjustString(expr);;
					}